

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

Availability __thiscall
miniscript::Node<CPubKey>::Satisfy<(anonymous_namespace)::Satisfier>
          (Node<CPubKey> *this,Satisfier *ctx,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *stack,bool nonmalleable)

{
  uint uVar1;
  Node<CPubKey> *node;
  ulong uVar2;
  pointer __args_2;
  pointer pSVar3;
  byte bVar4;
  Availability AVar5;
  byte bVar6;
  long in_FS_OFFSET;
  Span<miniscript::internal::InputResult> subres;
  anon_class_8_1_ba1d3d87 local_130;
  vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack_1;
  _Storage<miniscript::internal::InputResult,_false> local_f0;
  undefined1 local_a0;
  undefined1 local_98 [80];
  char local_48;
  bool *local_38;
  
  local_38 = *(bool **)(in_FS_OFFSET + 0x28);
  stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  results.
  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
  local_130.ctx = ctx;
  std::
  vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2})const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::No...State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#1})const::StackElem>>
  ::
  emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState>
            ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::No___State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_1_)const::StackElem>>
              *)&stack_1,this,(int *)local_98,local_38);
  while (pSVar3 = stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
        super__Vector_impl_data._M_start) {
    node = stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].node;
    uVar2 = stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].expanded;
    __args_2 = (node->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    subres.m_size =
         (long)(node->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__args_2 >> 4;
    if (uVar2 < subres.m_size) {
      stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].expanded = uVar2 + 1;
      local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
      std::
      vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2})const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#2}>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::{lambda(miniscript::No...State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)#1})const::StackElem>>
      ::
      emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState>
                ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<miniscript::internal::InputResult,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_)const::DummyState,miniscript::Node<CPubKey>::TreeEval<miniscript::internal::InputResult,miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_2_>(miniscript::Node<CPubKey>::ProduceInput<(anonymous_namespace)::Satisfier>((anonymous_namespace)::Satisfier_const&)const::_lambda(miniscript::No___State,miniscript::Node<CPubKey>const&,Span<miniscript::internal::InputResult>)_1_)const::StackElem>>
                  *)&stack_1,
                 __args_2[uVar2].
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(int *)local_98,(bool *)__args_2);
    }
    else {
      if ((ulong)(((long)results.
                         super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)results.
                        super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x50) < subres.m_size) {
        __assert_fail("results.size() >= node.subs.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x273,
                      "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = miniscript::internal::InputResult, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                     );
      }
      subres.m_data =
           (InputResult *)
           ((long)results.
                  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                  ._M_impl.super__Vector_impl_data._M_start +
           subres.m_size * -0x50 +
           ((long)results.
                  super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)results.
                 super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                 ._M_impl.super__Vector_impl_data._M_start));
      anon_func::anon_class_8_1_ba1d3d87::operator()(&local_f0._M_value,&local_130,node,subres);
      uVar1 = (node->typ).m_flags;
      bVar4 = (byte)uVar1;
      if (((local_f0._M_value.nsat.available != NO & bVar4 >> 4) == 1) &&
         (local_f0._M_value.nsat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_f0._M_value.nsat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        __assert_fail("ret.nsat.stack.size() == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x55b,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if (((local_f0._M_value.sat.available != NO & bVar4 >> 4) == 1) &&
         (local_f0._M_value.sat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_f0._M_value.sat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        __assert_fail("ret.sat.stack.size() == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x55c,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if (((bVar4 >> 5 & local_f0._M_value.nsat.available != NO) == 1) &&
         ((long)local_f0._M_value.nsat.stack.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - local_f0._16_8_ != 0x18)) {
        __assert_fail("ret.nsat.stack.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x55f,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if (((local_f0._M_value.sat.available != NO & bVar4 >> 5) == 1) &&
         ((long)local_f0._M_value.sat.stack.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - local_f0._56_8_ != 0x18)) {
        __assert_fail("ret.sat.stack.size() == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x560,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      bVar6 = bVar4 >> 6 & local_f0._M_value.sat.available != NO;
      if ((bVar6 == 1) &&
         (local_f0._M_value.sat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_f0._M_value.sat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        __assert_fail("ret.sat.stack.size() >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x564,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if (((local_f0._M_value.nsat.available != NO & bVar4 >> 6) == 1) &&
         (local_f0._M_value.nsat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_f0._M_value.nsat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)) {
        __assert_fail("ret.nsat.stack.size() >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x565,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if ((bVar6 != 0) &&
         (local_f0._M_value.sat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_f0._M_value.sat.stack.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        __assert_fail("!ret.sat.stack.back().empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x566,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if (local_f0._M_value.nsat.available == NO && (char)bVar4 < '\0') {
        __assert_fail("ret.nsat.available != Availability::NO",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x56a,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if (((char)bVar4 < '\0' & local_f0._M_value.nsat.has_sig) == 1) {
        __assert_fail("!ret.nsat.has_sig",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x56b,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if ((((char)bVar4 < '\0') && ((local_f0._M_value.nsat.malleable & 1U) == 0)) &&
         ((local_f0._M_value.nsat.non_canon & 1U) != 0)) {
        __assert_fail("!ret.nsat.non_canon",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x56c,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if ((local_f0._M_value.nsat.available != NO && (local_f0._M_value.nsat.has_sig & 1U) == 0) &&
          (uVar1 >> 10 & 1) != 0) {
        __assert_fail("ret.nsat.has_sig",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x56f,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if ((((byte)(uVar1 >> 0xb) & local_f0._M_value.sat.available != NO) == 1) &&
         (local_f0._M_value.sat.has_sig == false)) {
        __assert_fail("ret.sat.has_sig",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x570,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if ((uVar1 & 0x1200) == 0x1200 && local_f0._M_value.nsat.available == NO) {
        __assert_fail("ret.nsat.available != Availability::NO",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x573,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if (((uVar1 & 0x1200) == 0x1200 & local_f0._M_value.nsat.malleable) == 1) {
        __assert_fail("!ret.nsat.malleable",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x574,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if ((byte)(local_f0._M_value.sat.available != NO & local_f0._M_value.sat.malleable &
                (byte)(uVar1 >> 0xc)) == 1) {
        __assert_fail("!ret.sat.malleable",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x577,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      if (((local_f0._M_value.sat.available != NO) && ((local_f0._M_value.sat.malleable & 1U) == 0))
         && ((local_f0._M_value.sat.non_canon & 1U) != 0)) {
        __assert_fail("!ret.sat.non_canon",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x57a,
                      "auto miniscript::Node<CPubKey>::ProduceInput(const (anonymous namespace)::Satisfier &)::(anonymous class)::operator()(const Node<Key> &, Span<InputResult>) const [Key = CPubKey]"
                     );
      }
      std::optional<miniscript::internal::InputResult>::
      optional<miniscript::internal::InputResult,_true>
                ((optional<miniscript::internal::InputResult> *)
                 &((_Storage<miniscript::internal::InputResult,_false> *)local_98)->_M_value,
                 &local_f0._M_value);
      miniscript::internal::InputResult::~InputResult(&local_f0._M_value);
      if (local_48 == '\0') {
        local_a0 = 0;
        std::_Optional_payload_base<miniscript::internal::InputResult>::_M_reset
                  ((_Optional_payload_base<miniscript::internal::InputResult> *)
                   &((_Storage<miniscript::internal::InputResult,_false> *)local_98)->_M_value);
        goto LAB_003bb150;
      }
      std::
      vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
      ::erase(&results,results.
                       super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                       -((ulong)((long)(node->subs).
                                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(node->subs).
                                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4),
              (const_iterator)
              results.
              super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
              ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
      ::emplace_back<miniscript::internal::InputResult>
                (&results,&((_Storage<miniscript::internal::InputResult,_false> *)local_98)->
                           _M_value);
      stack_1.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar3 + -1;
      std::_Optional_payload_base<miniscript::internal::InputResult>::_M_reset
                ((_Optional_payload_base<miniscript::internal::InputResult> *)
                 &((_Storage<miniscript::internal::InputResult,_false> *)local_98)->_M_value);
    }
  }
  if ((long)results.
            super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)results.
            super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x50) {
    __assert_fail("results.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x27e,
                  "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = miniscript::internal::InputResult, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                 );
  }
  std::optional<miniscript::internal::InputResult>::
  optional<miniscript::internal::InputResult,_true>
            ((optional<miniscript::internal::InputResult> *)&local_f0._M_value,
             results.
             super__Vector_base<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
             ._M_impl.super__Vector_impl_data._M_start);
LAB_003bb150:
  std::vector<miniscript::internal::InputResult,_std::allocator<miniscript::internal::InputResult>_>
  ::~vector(&results);
  std::vector<StackElem,_std::allocator<StackElem>_>::~vector(&stack_1);
  local_98._8_8_ = local_f0._M_value.nsat.size;
  local_98._16_8_ =
       local_f0._M_value.nsat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98._24_8_ =
       local_f0._M_value.nsat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98._32_8_ =
       local_f0._M_value.nsat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f0._M_value.nsat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0._M_value.nsat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0._M_value.nsat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._40_8_ =
       ZEXT68(CONCAT15(local_f0._M_value.sat.malleable,
                       CONCAT14(local_f0._M_value.sat.has_sig,local_f0._M_value.sat.available)));
  local_98._48_8_ = local_f0._M_value.sat.size;
  local_98._56_8_ =
       local_f0._M_value.sat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98._64_8_ =
       local_f0._M_value.sat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98._72_8_ =
       local_f0._M_value.sat.stack.
       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_f0._M_value.sat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0._M_value.sat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0._M_value.sat.stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Optional_payload_base<miniscript::internal::InputResult>::_M_reset
            ((_Optional_payload_base<miniscript::internal::InputResult> *)&local_f0._M_value);
  if (nonmalleable) {
    AVar5 = NO;
    if (((bool)local_98[0x2d] != false) || (AVar5 = NO, (bool)local_98[0x2c] != true))
    goto LAB_003bb1ff;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::_M_move_assign(stack,(vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)((long)&(((_Storage<miniscript::internal::InputResult,_false> *)local_98
                                     )->_M_value).sat + 0x10));
  AVar5 = local_98._40_4_;
LAB_003bb1ff:
  miniscript::internal::InputResult::~InputResult
            (&((_Storage<miniscript::internal::InputResult,_false> *)local_98)->_M_value);
  if (*(bool **)(in_FS_OFFSET + 0x28) == local_38) {
    return AVar5;
  }
  __stack_chk_fail();
}

Assistant:

Availability Satisfy(const Ctx& ctx, std::vector<std::vector<unsigned char>>& stack, bool nonmalleable = true) const {
        auto ret = ProduceInput(ctx);
        if (nonmalleable && (ret.sat.malleable || !ret.sat.has_sig)) return Availability::NO;
        stack = std::move(ret.sat.stack);
        return ret.sat.available;
    }